

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNCalls_NotFulfilled_Test::~TEST_MockCallTest_expectNCalls_NotFulfilled_Test
          (TEST_MockCallTest_expectNCalls_NotFulfilled_Test *this)

{
  TEST_MockCallTest_expectNCalls_NotFulfilled_Test *this_local;
  
  ~TEST_MockCallTest_expectNCalls_NotFulfilled_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, expectNCalls_NotFulfilled)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(2, "boo")->callWasMade(1);
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectNCalls(2, "boo");
    mock().actualCall("boo");
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}